

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O0

EventListHandle EventListCreate(EventHandler event_handler,uint stack_size)

{
  int iVar1;
  EventList *event_list;
  uint stack_size_local;
  EventHandler event_handler_local;
  
  event_handler_local = (EventHandler)malloc(0x80);
  if ((EventList *)event_handler_local == (EventList *)0x0) {
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      LogWrite(0,"event_list","EventListCreate",0xcd,"malloc failed !");
    }
    event_handler_local = (EventHandler)0x0;
  }
  else {
    _mzero_event_list((EventList *)event_handler_local);
    _list_init((EventList *)event_handler_local);
    _register_event_handler((EventList *)event_handler_local,event_handler);
    _register_interuppt_handler((EventList *)event_handler_local);
    _worker_thread_create((EventList *)event_handler_local,stack_size);
  }
  return event_handler_local;
}

Assistant:

EventListHandle EventListCreate(EventHandler event_handler, unsigned int stack_size) {
  EventList *event_list;
  if (NULL == (event_list = (EventList *)uni_malloc(sizeof(EventList)))) {
    LOGE(TAG, "malloc failed !");
    return NULL;
  }

  _mzero_event_list(event_list);
  _list_init(event_list);
  _register_event_handler(event_list, event_handler);
  _register_interuppt_handler(event_list);
  _worker_thread_create(event_list, stack_size);
  return event_list;
}